

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O2

int parse_switches(j_compress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,boolean for_real
                  )

{
  int *piVar1;
  j_compress_ptr pjVar2;
  char *arg;
  boolean bVar3;
  boolean bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  char ch;
  j_compress_ptr local_78;
  long lval;
  int local_64;
  boolean local_60;
  int local_5c;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  icc_filename = (char *)0x0;
  outfilename = (char *)0x0;
  is_targa = 0;
  memdst = 0;
  report = 0;
  cinfo->err->trace_level = 0;
  local_60 = 0;
  local_64 = 0;
  local_40 = (char *)0x0;
  local_50 = (char *)0x0;
  local_48 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = (char *)0x0;
  local_78 = cinfo;
  local_5c = last_file_arg_seen;
  for (iVar8 = 1; pcVar9 = local_38, bVar3 = local_60, iVar8 < argc; iVar8 = iVar8 + 1) {
    if (*argv[iVar8] == '-') {
      pcVar9 = argv[iVar8] + 1;
      bVar3 = keymatch(pcVar9,"arithmetic",1);
      if (bVar3 == 0) {
        bVar4 = keymatch(pcVar9,"baseline",1);
        bVar3 = 1;
        if (bVar4 == 0) {
          bVar3 = keymatch(pcVar9,"dct",2);
          if (bVar3 == 0) {
            bVar3 = keymatch(pcVar9,"debug",1);
            if ((bVar3 == 0) && (bVar3 = keymatch(pcVar9,"verbose",1), bVar3 == 0)) {
              bVar3 = keymatch(pcVar9,"version",4);
              if (bVar3 != 0) goto LAB_00105ecc;
              bVar3 = keymatch(pcVar9,"grayscale",2);
              if ((bVar3 == 0) && (bVar3 = keymatch(pcVar9,"greyscale",2), bVar3 == 0)) {
                bVar3 = keymatch(pcVar9,"rgb",3);
                if (bVar3 == 0) {
                  bVar3 = keymatch(pcVar9,"icc",1);
                  if (bVar3 == 0) {
                    bVar3 = keymatch(pcVar9,"maxmemory",3);
                    if (bVar3 == 0) {
                      bVar3 = keymatch(pcVar9,"optimize",1);
                      if ((bVar3 == 0) &&
                         (bVar3 = keymatch(pcVar9,"optimise",1), pjVar2 = local_78, bVar3 == 0)) {
                        bVar3 = keymatch(pcVar9,"outfile",4);
                        if (bVar3 == 0) {
                          bVar3 = keymatch(pcVar9,"progressive",1);
                          if (bVar3 == 0) {
                            bVar3 = keymatch(pcVar9,"memdst",2);
                            if (bVar3 == 0) {
                              bVar3 = keymatch(pcVar9,"quality",1);
                              if (bVar3 == 0) {
                                bVar3 = keymatch(pcVar9,"qslots",2);
                                if (bVar3 == 0) {
                                  bVar3 = keymatch(pcVar9,"qtables",2);
                                  if (bVar3 == 0) {
                                    bVar3 = keymatch(pcVar9,"report",3);
                                    if (bVar3 == 0) {
                                      bVar3 = keymatch(pcVar9,"restart",1);
                                      if (bVar3 == 0) {
                                        bVar3 = keymatch(pcVar9,"sample",2);
                                        if (bVar3 == 0) {
                                          bVar3 = keymatch(pcVar9,"scans",4);
                                          if (bVar3 == 0) {
                                            bVar3 = keymatch(pcVar9,"smooth",2);
                                            if (bVar3 == 0) {
                                              bVar3 = keymatch(pcVar9,"targa",1);
                                              if (bVar3 == 0) goto LAB_00105ec7;
                                              is_targa = 1;
                                              bVar3 = local_60;
                                            }
                                            else {
                                              iVar8 = iVar8 + 1;
                                              if (((argc <= iVar8) ||
                                                  (iVar5 = __isoc99_sscanf(argv[iVar8],"%d",&lval),
                                                  iVar5 != 1)) || (100 < (uint)lval))
                                              goto LAB_00105ec7;
                                              pjVar2->smoothing_factor = (uint)lval;
                                              bVar3 = local_60;
                                            }
                                          }
                                          else {
                                            iVar8 = iVar8 + 1;
                                            if (argc <= iVar8) goto LAB_00105ec7;
                                            local_38 = argv[iVar8];
                                            bVar3 = local_60;
                                          }
                                        }
                                        else {
                                          iVar8 = iVar8 + 1;
                                          if (argc <= iVar8) goto LAB_00105ec7;
                                          local_58 = argv[iVar8];
                                          bVar3 = local_60;
                                        }
                                      }
                                      else {
                                        ch = 'x';
                                        iVar8 = iVar8 + 1;
                                        if (((argc <= iVar8) ||
                                            (iVar5 = __isoc99_sscanf(argv[iVar8],"%ld%c",&lval,&ch),
                                            iVar5 < 1)) ||
                                           (uVar6 = CONCAT44(lval._4_4_,(uint)lval), 0xffff < uVar6)
                                           ) goto LAB_00105ec7;
                                        if ((ch & 0xdfU) == 0x42) {
                                          pjVar2->restart_interval = (uint)lval;
                                          uVar6 = 0;
                                        }
                                        pjVar2->restart_in_rows = (int)uVar6;
                                        bVar3 = local_60;
                                      }
                                    }
                                    else {
                                      report = 1;
                                      bVar3 = local_60;
                                    }
                                  }
                                  else {
                                    iVar8 = iVar8 + 1;
                                    if (argc <= iVar8) goto LAB_00105ec7;
                                    local_50 = argv[iVar8];
                                    bVar3 = local_60;
                                  }
                                }
                                else {
                                  iVar8 = iVar8 + 1;
                                  if (argc <= iVar8) goto LAB_00105ec7;
                                  local_48 = argv[iVar8];
                                  bVar3 = local_60;
                                }
                              }
                              else {
                                iVar8 = iVar8 + 1;
                                if (argc <= iVar8) goto LAB_00105ec7;
                                local_40 = argv[iVar8];
                                bVar3 = local_60;
                              }
                            }
                            else {
                              memdst = 1;
                              bVar3 = local_60;
                            }
                          }
                          else {
                            local_64 = 1;
                            bVar3 = local_60;
                          }
                        }
                        else {
                          iVar8 = iVar8 + 1;
                          if (argc <= iVar8) goto LAB_00105ec7;
                          outfilename = argv[iVar8];
                          bVar3 = local_60;
                        }
                      }
                      else {
                        local_78->optimize_coding = 1;
                        bVar3 = local_60;
                      }
                    }
                    else {
                      ch = 'x';
                      iVar8 = iVar8 + 1;
                      if ((argc <= iVar8) ||
                         (iVar5 = __isoc99_sscanf(argv[iVar8],"%ld%c",&lval,&ch), iVar5 < 1))
                      goto LAB_00105ec7;
                      lVar7 = CONCAT44(lval._4_4_,(uint)lval) * 1000;
                      if ((ch & 0xdfU) != 0x4d) {
                        lVar7 = CONCAT44(lval._4_4_,(uint)lval);
                      }
                      local_78->mem->max_memory_to_use = lVar7 * 1000;
                      bVar3 = local_60;
                    }
                  }
                  else {
                    iVar8 = iVar8 + 1;
                    if (argc <= iVar8) goto LAB_00105ec7;
                    icc_filename = argv[iVar8];
                    bVar3 = local_60;
                  }
                }
                else {
                  jpeg_set_colorspace(local_78,JCS_RGB);
                  bVar3 = local_60;
                }
              }
              else {
                jpeg_set_colorspace(local_78,JCS_GRAYSCALE);
                bVar3 = local_60;
              }
            }
            else {
              if (parse_switches_printed_version == '\0') {
                fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                fprintf(_stderr,"%s\n\n",
                        "Copyright (C) 2009-2021 D. R. Commander\nCopyright (C) 2015, 2020 Google, Inc.\nCopyright (C) 2019-2020 Arm Limited\nCopyright (C) 2015-2016, 2018 Matthieu Darbois\nCopyright (C) 2011-2016 Siarhei Siamashka\nCopyright (C) 2015 Intel Corporation\nCopyright (C) 2013-2014 Linaro Limited\nCopyright (C) 2013-2014 MIPS Technologies, Inc.\nCopyright (C) 2009, 2012 Pierre Ossman for Cendio AB\nCopyright (C) 2009-2011 Nokia Corporation and/or its subsidiary(-ies)\nCopyright (C) 1999-2006 MIYASAKA Masaru\nCopyright (C) 1991-2020 Thomas G. Lane, Guido Vollbeding"
                       );
                fprintf(_stderr,"Emulating The Independent JPEG Group\'s software, version %s\n\n",
                        "6b  27-Mar-1998");
                parse_switches_printed_version = '\x01';
              }
              piVar1 = &local_78->err->trace_level;
              *piVar1 = *piVar1 + 1;
              bVar3 = local_60;
            }
          }
          else {
            iVar8 = iVar8 + 1;
            if (argc <= iVar8) goto LAB_00105ec7;
            bVar3 = keymatch(argv[iVar8],"int",1);
            if (bVar3 == 0) {
              bVar3 = keymatch(argv[iVar8],"fast",2);
              if (bVar3 == 0) {
                bVar3 = keymatch(argv[iVar8],"float",2);
                if (bVar3 == 0) goto LAB_00105ec7;
                local_78->dct_method = JDCT_FLOAT;
                bVar3 = local_60;
              }
              else {
                local_78->dct_method = JDCT_IFAST;
                bVar3 = local_60;
              }
            }
            else {
              local_78->dct_method = JDCT_ISLOW;
              bVar3 = local_60;
            }
          }
        }
      }
      else {
        local_78->arith_code = 1;
        bVar3 = local_60;
      }
    }
    else {
      if (0 < iVar8) break;
      outfilename = (char *)0x0;
    }
    local_60 = bVar3;
  }
  if (local_5c == 0) {
    return iVar8;
  }
  if ((((local_40 == (char *)0x0) ||
       (bVar4 = set_quality_ratings(local_78,local_40,local_60), bVar4 != 0)) &&
      (((arg = local_58, local_50 == (char *)0x0 ||
        (bVar3 = read_quant_tables(local_78,local_50,bVar3), bVar3 != 0)) &&
       ((local_48 == (char *)0x0 || (bVar3 = set_quant_slots(local_78,local_48), bVar3 != 0)))))) &&
     ((arg == (char *)0x0 || (bVar3 = set_sample_factors(local_78,arg), bVar3 != 0)))) {
    if (local_64 != 0) {
      jpeg_simple_progression(local_78);
    }
    if (pcVar9 == (char *)0x0) {
      return iVar8;
    }
    bVar3 = read_scan_script(local_78,pcVar9);
    if (bVar3 != 0) {
      return iVar8;
    }
  }
LAB_00105ec7:
  usage();
LAB_00105ecc:
  fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
  exit(0);
}

Assistant:

LOCAL(int)
parse_switches(j_compress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;
  boolean force_baseline;
  boolean simple_progressive;
  char *qualityarg = NULL;      /* saves -quality parm if any */
  char *qtablefile = NULL;      /* saves -qtables filename if any */
  char *qslotsarg = NULL;       /* saves -qslots parm if any */
  char *samplearg = NULL;       /* saves -sample parm if any */
  char *scansarg = NULL;        /* saves -scans parm if any */

  /* Set up default JPEG parameters. */

  force_baseline = FALSE;       /* by default, allow 16-bit quantizers */
  simple_progressive = FALSE;
  is_targa = FALSE;
  icc_filename = NULL;
  outfilename = NULL;
  memdst = FALSE;
  report = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "arithmetic", 1)) {
      /* Use arithmetic coding. */
#ifdef C_ARITH_CODING_SUPPORTED
      cinfo->arith_code = TRUE;
#else
      fprintf(stderr, "%s: sorry, arithmetic coding not supported\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "baseline", 1)) {
      /* Force baseline-compatible output (8-bit quantizer values). */
      force_baseline = TRUE;

    } else if (keymatch(arg, "dct", 2)) {
      /* Select DCT algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "int", 1)) {
        cinfo->dct_method = JDCT_ISLOW;
      } else if (keymatch(argv[argn], "fast", 2)) {
        cinfo->dct_method = JDCT_IFAST;
      } else if (keymatch(argv[argn], "float", 2)) {
        cinfo->dct_method = JDCT_FLOAT;
      } else
        usage();

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "grayscale", 2) ||
               keymatch(arg, "greyscale", 2)) {
      /* Force a monochrome JPEG file to be generated. */
      jpeg_set_colorspace(cinfo, JCS_GRAYSCALE);

    } else if (keymatch(arg, "rgb", 3)) {
      /* Force an RGB JPEG file to be generated. */
      jpeg_set_colorspace(cinfo, JCS_RGB);

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "optimize", 1) || keymatch(arg, "optimise", 1)) {
      /* Enable entropy parm optimization. */
#ifdef ENTROPY_OPT_SUPPORTED
      cinfo->optimize_coding = TRUE;
#else
      fprintf(stderr, "%s: sorry, entropy optimization was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "progressive", 1)) {
      /* Select simple progressive mode. */
#ifdef C_PROGRESSIVE_SUPPORTED
      simple_progressive = TRUE;
      /* We must postpone execution until num_components is known. */
#else
      fprintf(stderr, "%s: sorry, progressive output was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "memdst", 2)) {
      /* Use in-memory destination manager */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
      memdst = TRUE;
#else
      fprintf(stderr, "%s: sorry, in-memory destination manager was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "quality", 1)) {
      /* Quality ratings (quantization table scaling factors). */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qualityarg = argv[argn];

    } else if (keymatch(arg, "qslots", 2)) {
      /* Quantization table slot numbers. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qslotsarg = argv[argn];
      /* Must delay setting qslots until after we have processed any
       * colorspace-determining switches, since jpeg_set_colorspace sets
       * default quant table numbers.
       */

    } else if (keymatch(arg, "qtables", 2)) {
      /* Quantization tables fetched from file. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qtablefile = argv[argn];
      /* We postpone actually reading the file in case -quality comes later. */

    } else if (keymatch(arg, "report", 3)) {
      report = TRUE;

    } else if (keymatch(arg, "restart", 1)) {
      /* Restart interval in MCU rows (or in MCUs with 'b'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (lval < 0 || lval > 65535L)
        usage();
      if (ch == 'b' || ch == 'B') {
        cinfo->restart_interval = (unsigned int)lval;
        cinfo->restart_in_rows = 0; /* else prior '-restart n' overrides me */
      } else {
        cinfo->restart_in_rows = (int)lval;
        /* restart_interval will be computed during startup */
      }

    } else if (keymatch(arg, "sample", 2)) {
      /* Set sampling factors. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      samplearg = argv[argn];
      /* Must delay setting sample factors until after we have processed any
       * colorspace-determining switches, since jpeg_set_colorspace sets
       * default sampling factors.
       */

    } else if (keymatch(arg, "scans", 4)) {
      /* Set scan script. */
#ifdef C_MULTISCAN_FILES_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      scansarg = argv[argn];
      /* We must postpone reading the file in case -progressive appears. */
#else
      fprintf(stderr, "%s: sorry, multi-scan output was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "smooth", 2)) {
      /* Set input smoothing factor. */
      int val;

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%d", &val) != 1)
        usage();
      if (val < 0 || val > 100)
        usage();
      cinfo->smoothing_factor = val;

    } else if (keymatch(arg, "targa", 1)) {
      /* Input file is Targa format. */
      is_targa = TRUE;

    } else {
      usage();                  /* bogus switch */
    }
  }

  /* Post-switch-scanning cleanup */

  if (for_real) {

    /* Set quantization tables for selected quality. */
    /* Some or all may be overridden if -qtables is present. */
    if (qualityarg != NULL)     /* process -quality if it was present */
      if (!set_quality_ratings(cinfo, qualityarg, force_baseline))
        usage();

    if (qtablefile != NULL)     /* process -qtables if it was present */
      if (!read_quant_tables(cinfo, qtablefile, force_baseline))
        usage();

    if (qslotsarg != NULL)      /* process -qslots if it was present */
      if (!set_quant_slots(cinfo, qslotsarg))
        usage();

    if (samplearg != NULL)      /* process -sample if it was present */
      if (!set_sample_factors(cinfo, samplearg))
        usage();

#ifdef C_PROGRESSIVE_SUPPORTED
    if (simple_progressive)     /* process -progressive; -scans can override */
      jpeg_simple_progression(cinfo);
#endif

#ifdef C_MULTISCAN_FILES_SUPPORTED
    if (scansarg != NULL)       /* process -scans if it was present */
      if (!read_scan_script(cinfo, scansarg))
        usage();
#endif
  }

  return argn;                  /* return index of next arg (file name) */
}